

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

string * fs_generate_random_alphanumeric_string_abi_cxx11_
                   (string *__return_storage_ptr__,size_type len)

{
  long lVar1;
  pointer pcVar2;
  result_type rVar3;
  size_type sVar4;
  long *in_FS_OFFSET;
  seed_seq seed_seq;
  uniform_int_distribution<unsigned_long> dist;
  array<unsigned_int,_1248UL> seed;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_2750;
  anon_union_5000_2_650ea050_for_random_device_0 local_2738;
  uint local_13b0 [1248];
  
  lVar1 = *in_FS_OFFSET;
  if (*(char *)(lVar1 + -8) == '\0') {
    memset(local_13b0,0,0x1380);
    std::random_device::random_device((random_device *)&local_2738);
    std::generate_n<unsigned_int*,unsigned_long,std::reference_wrapper<std::random_device>>
              (local_13b0,0x4e0,(random_device *)&local_2738);
    std::seed_seq::seed_seq<unsigned_int*>
              ((seed_seq *)&local_2750,local_13b0,(uint *)&stack0xffffffffffffffd0);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed<std::seed_seq>
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)(lVar1 + -0x1390),(seed_seq *)&local_2750);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_2750);
    std::random_device::~random_device((random_device *)&local_2738.field_0);
    *(undefined1 *)(lVar1 + -8) = 1;
  }
  local_2738.field_0._M_file = (void *)0x0;
  local_2738._M_mt._M_x[1] = 0x3d;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)len);
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  for (sVar4 = 0; len != sVar4; sVar4 = sVar4 + 1) {
    rVar3 = std::uniform_int_distribution<unsigned_long>::operator()
                      ((uniform_int_distribution<unsigned_long> *)&local_2738.field_0,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)(lVar1 + -0x1390));
    pcVar2[sVar4] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar3];
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_generate_random_alphanumeric_string(const std::string::size_type len)
{
#ifdef __cpp_deduction_guides
  constexpr std::string_view chars =
      "0123456789"
      "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
      "abcdefghijklmnopqrstuvwxyz";
  thread_local auto rng = fs_random_generator<>();
  auto dist = std::uniform_int_distribution<std::string::size_type>(0, chars.length() - 1);
  auto result = std::string(len, '\0');
  std::generate_n(std::begin(result), len, [&]() { return chars[dist(rng)]; });
  return result;
#else
  fs_print_error("" , __func__, std::make_error_code(std::errc::function_not_supported));
  return {};
#endif
}